

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall
CollisionCallback<Blob<128>_>::operator()(CollisionCallback<Blob<128>_> *this,void *key,int len)

{
  _Rb_tree<Blob<128>,_Blob<128>,_std::_Identity<Blob<128>_>,_std::less<Blob<128>_>,_std::allocator<Blob<128>_>_>
  *this_00;
  const_iterator cVar1;
  mapped_type *this_01;
  Blob<128> h;
  ByteVec local_50;
  key_type local_38;
  
  local_38.bytes[0] = '\0';
  local_38.bytes[1] = '\0';
  local_38.bytes[2] = '\0';
  local_38.bytes[3] = '\0';
  local_38.bytes[4] = '\0';
  local_38.bytes[5] = '\0';
  local_38.bytes[6] = '\0';
  local_38.bytes[7] = '\0';
  local_38.bytes[8] = '\0';
  local_38.bytes[9] = '\0';
  local_38.bytes[10] = '\0';
  local_38.bytes[0xb] = '\0';
  local_38.bytes[0xc] = '\0';
  local_38.bytes[0xd] = '\0';
  local_38.bytes[0xe] = '\0';
  local_38.bytes[0xf] = '\0';
  (*this->m_pfHash)(key,len,0,&local_38);
  this_00 = (_Rb_tree<Blob<128>,_Blob<128>,_std::_Identity<Blob<128>_>,_std::less<Blob<128>_>,_std::allocator<Blob<128>_>_>
             *)this->m_collisions;
  cVar1 = std::
          _Rb_tree<Blob<128>,_Blob<128>,_std::_Identity<Blob<128>_>,_std::less<Blob<128>_>,_std::allocator<Blob<128>_>_>
          ::find(this_00,&local_38);
  if ((_Rb_tree_header *)cVar1._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
    this_01 = std::
              map<Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>,_std::less<Blob<128>_>,_std::allocator<std::pair<const_Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>_>_>_>
              ::operator[](&this->m_collmap->
                            super_map<Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>,_std::less<Blob<128>_>,_std::allocator<std::pair<const_Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>_>_>_>
                           ,&local_38);
    ByteVec::ByteVec(&local_50,key,len);
    std::vector<ByteVec,_std::allocator<ByteVec>_>::emplace_back<ByteVec>(this_01,&local_50);
    if (local_50.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    hashtype h;

    m_pfHash(key,len,0,&h);

    if(m_collisions.count(h))
    {
      m_collmap[h].push_back( ByteVec(key,len) );
    }
  }